

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::initPltAndChk(Amr *this)

{
  int iVar1;
  int chvInt;
  ParmParse pp;
  int phvInt;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  ParmParse local_98;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"amr","");
  ParmParse::ParmParse(&local_98,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  ParmParse::queryAdd<bool,_0>
            (&local_98,"checkpoint_files_output",
             (bool *)&(anonymous_namespace)::checkpoint_files_output);
  ParmParse::queryAdd<bool,_0>
            (&local_98,"plot_files_output",(bool *)&(anonymous_namespace)::plot_files_output);
  ParmParse::queryAdd<int,_0>(&local_98,"plot_nfiles",&(anonymous_namespace)::plot_nfiles);
  ParmParse::queryAdd<int,_0>
            (&local_98,"checkpoint_nfiles",&(anonymous_namespace)::checkpoint_nfiles);
  if ((anonymous_namespace)::plot_nfiles == -1) {
    (anonymous_namespace)::plot_nfiles = *(int *)(ParallelContext::frames + 0x10);
  }
  if ((anonymous_namespace)::checkpoint_nfiles == -1) {
    (anonymous_namespace)::checkpoint_nfiles = *(int *)(ParallelContext::frames + 0x10);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->check_file_root,0,(char *)(this->check_file_root)._M_string_length,
             0x775b8d);
  ParmParse::queryAdd(&local_98,"check_file",&this->check_file_root);
  this->check_int = -1;
  ParmParse::queryAdd<int,_0>(&local_98,"check_int",&this->check_int);
  this->check_per = -1.0;
  ParmParse::queryAdd<double,_0>(&local_98,"check_per",&this->check_per);
  if (((0 < this->check_int) && (0.0 < this->check_per)) &&
     (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    Warning_host((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->plot_file_root,0,(char *)(this->plot_file_root)._M_string_length,0x775c21
            );
  ParmParse::queryAdd(&local_98,"plot_file",&this->plot_file_root);
  this->plot_int = -1;
  ParmParse::queryAdd<int,_0>(&local_98,"plot_int",&this->plot_int);
  this->plot_per = -1.0;
  ParmParse::queryAdd<double,_0>(&local_98,"plot_per",&this->plot_per);
  this->plot_log_per = -1.0;
  ParmParse::queryAdd<double,_0>(&local_98,"plot_log_per",&this->plot_log_per);
  if (((0 < this->plot_int) && (0.0 < this->plot_per)) &&
     (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    Warning_host((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->small_plot_file_root,0,
             (char *)(this->small_plot_file_root)._M_string_length,0x775c1c);
  ParmParse::queryAdd(&local_98,"small_plot_file",&this->small_plot_file_root);
  this->small_plot_int = -1;
  ParmParse::queryAdd<int,_0>(&local_98,"small_plot_int",&this->small_plot_int);
  this->small_plot_per = -1.0;
  ParmParse::queryAdd<double,_0>(&local_98,"small_plot_per",&this->small_plot_per);
  this->small_plot_log_per = -1.0;
  ParmParse::queryAdd<double,_0>(&local_98,"small_plot_log_per",&this->small_plot_log_per);
  if (((0 < this->small_plot_int) && (0.0 < this->small_plot_per)) &&
     (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    Warning_host((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  this->write_plotfile_with_checkpoint = 1;
  ParmParse::queryAdd<int,_0>
            (&local_98,"write_plotfile_with_checkpoint",&this->write_plotfile_with_checkpoint);
  this->stream_max_tries = 4;
  ParmParse::queryAdd<int,_0>(&local_98,"stream_max_tries",&this->stream_max_tries);
  iVar1 = 1;
  if (1 < this->stream_max_tries) {
    iVar1 = this->stream_max_tries;
  }
  this->stream_max_tries = iVar1;
  this->abort_on_stream_retry_failure = false;
  ParmParse::queryAdd<bool,_0>
            (&local_98,"abort_on_stream_retry_failure",&this->abort_on_stream_retry_failure);
  ParmParse::queryAdd<bool,_0>
            (&local_98,"precreateDirectories",(bool *)&(anonymous_namespace)::precreateDirectories);
  ParmParse::queryAdd<bool,_0>
            (&local_98,"prereadFAHeaders",(bool *)&(anonymous_namespace)::prereadFAHeaders);
  local_40._M_dataplus._M_p._0_4_ = (anonymous_namespace)::plot_headerversion;
  iVar1 = (anonymous_namespace)::checkpoint_headerversion;
  ParmParse::queryAdd<int,_0>(&local_98,"plot_headerversion",(int *)&local_40);
  if ((int)local_40._M_dataplus._M_p != (anonymous_namespace)::plot_headerversion) {
    (anonymous_namespace)::plot_headerversion = (int)local_40._M_dataplus._M_p;
  }
  ParmParse::queryAdd<int,_0>(&local_98,"checkpoint_headerversion",(int *)&stack0xffffffffffffff64);
  if (iVar1 != (anonymous_namespace)::checkpoint_headerversion) {
    (anonymous_namespace)::checkpoint_headerversion = iVar1;
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_98);
  return;
}

Assistant:

void
Amr::initPltAndChk ()
{
    ParmParse pp("amr");

    pp.queryAdd("checkpoint_files_output", checkpoint_files_output);
    pp.queryAdd("plot_files_output", plot_files_output);

    pp.queryAdd("plot_nfiles", plot_nfiles);
    pp.queryAdd("checkpoint_nfiles", checkpoint_nfiles);
    //
    // -1 ==> use ParallelDescriptor::NProcs().
    //
    if (plot_nfiles       == -1) plot_nfiles       = ParallelDescriptor::NProcs();
    if (checkpoint_nfiles == -1) checkpoint_nfiles = ParallelDescriptor::NProcs();

    check_file_root = "chk";
    pp.queryAdd("check_file",check_file_root);

    check_int = -1;
    pp.queryAdd("check_int",check_int);

    check_per = -1.0;
    pp.queryAdd("check_per",check_per);

    if (check_int > 0 && check_per > 0)
    {
        if (ParallelDescriptor::IOProcessor())
            amrex::Warning("Warning: both amr.check_int and amr.check_per are > 0.");
    }

    plot_file_root = "plt";
    pp.queryAdd("plot_file",plot_file_root);

    plot_int = -1;
    pp.queryAdd("plot_int",plot_int);

    plot_per = -1.0;
    pp.queryAdd("plot_per",plot_per);

    plot_log_per = -1.0;
    pp.queryAdd("plot_log_per",plot_log_per);

    if (plot_int > 0 && plot_per > 0)
    {
        if (ParallelDescriptor::IOProcessor())
            amrex::Warning("Warning: both amr.plot_int and amr.plot_per are > 0.");
    }

    small_plot_file_root = "smallplt";
    pp.queryAdd("small_plot_file",small_plot_file_root);

    small_plot_int = -1;
    pp.queryAdd("small_plot_int",small_plot_int);

    small_plot_per = -1.0;
    pp.queryAdd("small_plot_per",small_plot_per);

    small_plot_log_per = -1.0;
    pp.queryAdd("small_plot_log_per",small_plot_log_per);

    if (small_plot_int > 0 && small_plot_per > 0)
    {
        if (ParallelDescriptor::IOProcessor())
            amrex::Warning("Warning: both amr.small_plot_int and amr.small_plot_per are > 0.");
    }

    write_plotfile_with_checkpoint = 1;
    pp.queryAdd("write_plotfile_with_checkpoint",write_plotfile_with_checkpoint);

    stream_max_tries = 4;
    pp.queryAdd("stream_max_tries",stream_max_tries);
    stream_max_tries = std::max(stream_max_tries, 1);

    abort_on_stream_retry_failure = false;
    pp.queryAdd("abort_on_stream_retry_failure",abort_on_stream_retry_failure);

    pp.queryAdd("precreateDirectories", precreateDirectories);
    pp.queryAdd("prereadFAHeaders", prereadFAHeaders);

    int phvInt(plot_headerversion), chvInt(checkpoint_headerversion);
    pp.queryAdd("plot_headerversion", phvInt);
    if(phvInt != plot_headerversion) {
      plot_headerversion = static_cast<VisMF::Header::Version> (phvInt);
    }
    pp.queryAdd("checkpoint_headerversion", chvInt);
    if(chvInt != checkpoint_headerversion) {
      checkpoint_headerversion = static_cast<VisMF::Header::Version> (chvInt);
    }
}